

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

bool __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::
iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::KeyValuePair>
::revalidate_if_necessary
          (iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::KeyValuePair>
           *this,TreeIterator *it)

{
  void **ppvVar1;
  void *pvVar2;
  Node *l;
  LogMessage *other;
  Node *pNVar3;
  ulong uVar4;
  Node *k;
  InnerMap *this_00;
  bool bVar5;
  LogFinisher local_59;
  LogMessage local_58;
  
  k = this->node_;
  this_00 = this->m_;
  if (this_00 == (InnerMap *)0x0 || k == (Node *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x1cb);
    other = internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: node_ != NULL && m_ != NULL: ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
    k = this->node_;
    this_00 = this->m_;
  }
  uVar4 = this_00->num_buckets_ - 1 & this->bucket_index_;
  this->bucket_index_ = uVar4;
  pNVar3 = (Node *)this_00->table_[uVar4];
  bVar5 = true;
  if (pNVar3 != k) {
    if ((pNVar3 != (Node *)0x0) && (pNVar3 != (Node *)this_00->table_[uVar4 ^ 1])) {
      do {
        pNVar3 = pNVar3->next;
        if (pNVar3 == k) break;
      } while (pNVar3 != (Node *)0x0);
      if (pNVar3 != (Node *)0x0) {
        return true;
      }
    }
    InnerMap::find((const_iterator *)&local_58,this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)k,it);
    this->bucket_index_ = local_58._16_8_;
    ppvVar1 = this->m_->table_;
    pvVar2 = ppvVar1[local_58._16_8_];
    if (pvVar2 != (void *)0x0) {
      bVar5 = pvVar2 != ppvVar1[local_58._16_8_ ^ 1];
    }
  }
  return bVar5;
}

Assistant:

bool revalidate_if_necessary(TreeIterator* it) {
        GOOGLE_DCHECK(node_ != NULL && m_ != NULL);
        // Force bucket_index_ to be in range.
        bucket_index_ &= (m_->num_buckets_ - 1);
        // Common case: the bucket we think is relevant points to node_.
        if (m_->table_[bucket_index_] == static_cast<void*>(node_))
          return true;
        // Less common: the bucket is a linked list with node_ somewhere in it,
        // but not at the head.
        if (m_->TableEntryIsNonEmptyList(bucket_index_)) {
          Node* l = static_cast<Node*>(m_->table_[bucket_index_]);
          while ((l = l->next) != NULL) {
            if (l == node_) {
              return true;
            }
          }
        }
        // Well, bucket_index_ still might be correct, but probably
        // not.  Revalidate just to be sure.  This case is rare enough that we
        // don't worry about potential optimizations, such as having a custom
        // find-like method that compares Node* instead of const Key&.
        iterator_base i(m_->find(*KeyPtrFromNodePtr(node_), it));
        bucket_index_ = i.bucket_index_;
        return m_->TableEntryIsList(bucket_index_);
      }